

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void * rw::ps2::createNativeRaster(void *object,int32 offset,int32 param_3)

{
  undefined8 *puVar1;
  Ps2Raster *raster;
  int32 param_2_local;
  int32 offset_local;
  void *object_local;
  
  puVar1 = (undefined8 *)((long)object + (long)nativeRasterOffset);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  *(short *)((long)puVar1 + 0xc) = (short)defaultMipMapKL;
  *(undefined1 *)((long)puVar1 + 0xe) = 0;
  *(undefined1 *)((long)puVar1 + 0xf) = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined4 *)(puVar1 + 4) = 0;
  *(undefined4 *)((long)puVar1 + 0x24) = 0;
  *(undefined4 *)(puVar1 + 5) = 0;
  *(undefined1 *)((long)puVar1 + 0x2c) = 0;
  *(undefined4 *)(puVar1 + 7) = 0;
  puVar1[6] = 0;
  return object;
}

Assistant:

static void*
createNativeRaster(void *object, int32 offset, int32)
{
	Ps2Raster *raster = GETPS2RASTEREXT(object);
	raster->tex0 = 0;
	raster->paletteBase = 0;
	raster->kl = defaultMipMapKL;
	raster->tex1low = 0;
	raster->unk2 = 0;
	raster->miptbp1 = 0;
	raster->miptbp2 = 0;
	raster->pixelSize = 0;
	raster->paletteSize = 0;
	raster->totalSize = 0;
	raster->flags = 0;

	raster->dataSize = 0;
	raster->data = nil;
	return object;
}